

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rawseti(lua_State *L,int idx,lua_Integer n)

{
  TValue *pTVar1;
  StkId pTVar2;
  
  pTVar1 = index2addr(L,idx);
  luaH_setint(L,(Table *)(pTVar1->value_).gc,n,L->top + -1);
  pTVar2 = L->top;
  if ((((pTVar2[-1].tt_ & 0x40) != 0) && ((((Table *)(pTVar1->value_).gc)->marked & 4) != 0)) &&
     (((pTVar2[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,(Table *)(pTVar1->value_).gc);
    pTVar2 = L->top;
  }
  L->top = pTVar2 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti (lua_State *L, int idx, lua_Integer n) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttistable(o), "table expected");
  luaH_setint(L, hvalue(o), n, L->top - 1);
  luaC_barrierback(L, hvalue(o), L->top-1);
  L->top--;
  lua_unlock(L);
}